

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O1

size_t ht_registry_push_registry_klasses_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  HT_EventIdProvider *pHVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  HT_EventKlassInfoEvent event;
  HT_Byte data [4096];
  size_t local_10c0;
  HT_Event local_10a8;
  undefined4 local_1090;
  undefined8 local_1088;
  undefined1 local_1080;
  HT_Event local_1078;
  undefined4 local_1060;
  undefined8 local_1058;
  undefined8 local_1050;
  undefined8 local_1048;
  undefined1 local_1040;
  uint8_t local_1038 [4104];
  
  ht_mutex_lock(event_klass_registry_register_mutex);
  if (event_klass_register.size == 0) {
    sVar6 = 0;
    sVar8 = 0;
  }
  else {
    sVar8 = 0;
    uVar7 = 0;
    sVar6 = 0;
    do {
      plVar1 = (long *)event_klass_register.data[uVar7];
      local_10a8.klass = ht_HT_EventKlassInfoEvent_get_event_klass_instance();
      pHVar4 = ht_event_id_provider_get_default();
      local_10a8.id = ht_event_id_provider_next(pHVar4);
      local_10a8.timestamp = ht_monotonic_clock_get_timestamp();
      local_1088 = *(undefined8 *)*plVar1;
      local_1090 = (undefined4)plVar1[3];
      local_1080 = *(undefined1 *)((undefined8 *)*plVar1 + 1);
      sVar5 = ht_HT_EventKlassInfoEvent_get_size(&local_10a8);
      if (0x1000 - sVar6 < sVar5) {
        (*callback)(local_1038,sVar6,serialize,listener);
        sVar5 = 0;
        local_10c0 = sVar6;
      }
      else {
        local_10c0 = 0;
        sVar5 = sVar6;
      }
      sVar6 = ht_event_utils_serialize_event_to_buffer(&local_10a8,local_1038 + sVar5,serialize);
      sVar6 = sVar6 + sVar5;
      if (*(long *)(*plVar1 + 8) != 0) {
        lVar10 = 0x28;
        uVar9 = 0;
        do {
          local_1078.klass = ht_HT_EventKlassFieldInfoEvent_get_event_klass_instance();
          lVar2 = *(long *)(*plVar1 + 0x20);
          pHVar4 = ht_event_id_provider_get_default();
          local_1078.id = ht_event_id_provider_next(pHVar4);
          local_1078.timestamp = ht_monotonic_clock_get_timestamp();
          iVar3 = *(int *)(lVar2 + lVar10);
          if ((iVar3 == 3) && (*(int *)(lVar2 + -8 + lVar10) == 0)) {
            iVar3 = 99;
          }
          local_1040 = (undefined1)iVar3;
          local_1060 = (undefined4)plVar1[3];
          local_1050 = *(undefined8 *)(lVar2 + -0x20 + lVar10);
          local_1058 = *(undefined8 *)(lVar2 + -0x28 + lVar10);
          local_1048 = *(undefined8 *)(lVar2 + -0x18 + lVar10);
          sVar5 = ht_HT_EventKlassFieldInfoEvent_get_size(&local_1078);
          if (0x1000 - sVar6 < sVar5) {
            (*callback)(local_1038,sVar6,serialize,listener);
            local_10c0 = local_10c0 + sVar6;
            sVar6 = 0;
          }
          sVar5 = ht_event_utils_serialize_event_to_buffer(&local_1078,local_1038 + sVar6,serialize)
          ;
          sVar6 = sVar6 + sVar5;
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x30;
        } while (uVar9 < *(ulong *)(*plVar1 + 8));
      }
      sVar8 = sVar8 + local_10c0;
      uVar7 = uVar7 + 1;
    } while (uVar7 < event_klass_register.size);
  }
  ht_mutex_unlock(event_klass_registry_register_mutex);
  if (sVar6 != 0) {
    (*callback)(local_1038,sVar6,serialize,listener);
    sVar8 = sVar8 + sVar6;
  }
  return sVar8;
}

Assistant:

size_t
ht_registry_push_registry_klasses_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t i;
    size_t total_size = 0;

    HT_Byte data[REGISTRY_LISETNER_BUFF_SIZE];
    size_t data_pos = 0;

    ht_mutex_lock(event_klass_registry_register_mutex);

    for (i = 0; i < event_klass_register.size; i++)
    {
        total_size += _ht_registry_push_class_to_listener((HT_EventKlass*)event_klass_register.data[i], data, &data_pos, callback, listener, serialize);
    }

    ht_mutex_unlock(event_klass_registry_register_mutex);

    if (data_pos > 0)
    {
        callback(data, data_pos, serialize, listener);
        total_size += data_pos;
    }

    return total_size;
}